

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

FConfigFile * __thiscall FConfigFile::operator=(FConfigFile *this,FConfigFile *other)

{
  FConfigEntry *pFVar1;
  FConfigSection *section;
  FConfigFile *this_00;
  FConfigSection *pFVar2;
  
  ClearConfig(this);
  for (pFVar2 = other->Sections; pFVar2 != (FConfigSection *)0x0; pFVar2 = pFVar2->Next) {
    pFVar1 = pFVar2->RootEntry;
    this_00 = this;
    section = NewConfigSection(this,(pFVar2->SectionName).Chars);
    for (; pFVar1 != (FConfigEntry *)0x0; pFVar1 = pFVar1->Next) {
      NewConfigEntry(this_00,section,pFVar1->Key,pFVar1->Value);
    }
  }
  return this;
}

Assistant:

FConfigFile &FConfigFile::operator = (const FConfigFile &other)
{
	FConfigSection *fromsection, *tosection;
	FConfigEntry *fromentry;

	ClearConfig ();
	fromsection = other.Sections;
	while (fromsection != NULL)
	{
		fromentry = fromsection->RootEntry;
		tosection = NewConfigSection (fromsection->SectionName);
		while (fromentry != NULL)
		{
			NewConfigEntry (tosection, fromentry->Key, fromentry->Value);
			fromentry = fromentry->Next;
		}
		fromsection = fromsection->Next;
	}
	return *this;
}